

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Proc_topology(int g_a,int proc,int *coord)

{
  long in_RDX;
  int in_ESI;
  int in_EDI;
  int i;
  Integer _ga_work [7];
  Integer ndim;
  Integer p;
  Integer a;
  Integer in_stack_00000180;
  Integer *in_stack_000001a0;
  Integer in_stack_000001a8;
  Integer in_stack_000001b0;
  int local_6c;
  undefined8 local_68 [8];
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_18 = (long)in_EDI;
  local_20 = (long)in_ESI;
  local_10 = in_RDX;
  local_28 = pnga_ndim(in_stack_00000180);
  pnga_proc_topology(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0);
  for (local_6c = 0; local_6c < local_28; local_6c = local_6c + 1) {
    *(int *)(local_10 + (long)local_6c * 4) = (int)local_68[local_6c];
  }
  return;
}

Assistant:

void NGA_Proc_topology(int g_a, int proc, int coord[])
{
     Integer a=(Integer)g_a;
     Integer p=(Integer)proc;
     Integer ndim = wnga_ndim(a);
     Integer _ga_work[MAXDIM];
     wnga_proc_topology(a, p, _ga_work);
     COPY(int,_ga_work, coord,ndim);  
}